

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void it<bool(*)()>(string *name,_func_bool *f)

{
  bool bVar1;
  ostream *poVar2;
  _func_bool *f_local;
  string *name_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"It ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::operator<<(poVar2,"...");
  bVar1 = (*f)();
  if (bVar1) {
    std::operator<<((ostream *)&std::cout," [Pass]");
  }
  else {
    std::operator<<((ostream *)&std::cout," [Failed]");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void it(const std::string &name, TestFunc f, Args... args) {
    std::cout << "It " << name << "...";
    if (f(args...)) {
        std::cout << " [Pass]";
    } else {
        std::cout << " [Failed]";
    }
    std::cout << std::endl;
}